

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Sfm_ObjSetupSimInfo(Abc_Obj_t *pObj)

{
  long *plVar1;
  ulong *puVar2;
  long *plVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  undefined4 *puVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  int Indexes [2] [64];
  undefined4 local_238 [130];
  
  plVar3 = (long *)pObj->pNtk->pData;
  plVar1 = plVar3 + 0x37;
  plVar3[0x3b] = 0;
  plVar3[0x3c] = 0;
  iVar4 = (int)plVar3[0x13];
  uVar6 = (long)iVar4 * 8;
  iVar8 = (int)uVar6;
  if ((int)plVar3[0x37] < iVar8) {
    sVar9 = (long)iVar4 << 6;
    if ((void *)plVar3[0x38] == (void *)0x0) {
      pvVar5 = malloc(sVar9);
    }
    else {
      pvVar5 = realloc((void *)plVar3[0x38],sVar9);
    }
    plVar3[0x38] = (long)pvVar5;
    if (pvVar5 == (void *)0x0) goto LAB_00520451;
    *(int *)plVar1 = iVar8;
  }
  if (0 < iVar4) {
    memset((void *)plVar3[0x38],0,(uVar6 & 0xffffffff) << 3);
  }
  *(int *)((long)plVar3 + 0x1bc) = iVar8;
  iVar4 = (int)plVar3[0x13];
  uVar6 = (long)iVar4 * 8;
  iVar8 = (int)uVar6;
  if ((int)plVar3[0x39] < iVar8) {
    sVar9 = (long)iVar4 << 6;
    if ((void *)plVar3[0x3a] == (void *)0x0) {
      pvVar5 = malloc(sVar9);
    }
    else {
      pvVar5 = realloc((void *)plVar3[0x3a],sVar9);
    }
    plVar3[0x3a] = (long)pvVar5;
    if (pvVar5 == (void *)0x0) {
LAB_00520451:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    *(int *)(plVar3 + 0x39) = iVar8;
  }
  if (0 < iVar4) {
    memset((void *)plVar3[0x3a],0,(uVar6 & 0xffffffff) << 3);
  }
  *(int *)((long)plVar3 + 0x1cc) = iVar8;
  iVar4 = (((int)*(uint *)(plVar3 + 0x13) >> 4) + 1) - (uint)((*(uint *)(plVar3 + 0x13) & 0xf) == 0)
  ;
  *(int *)(plVar3 + 0x3d) = iVar4;
  if (*(int *)((long)plVar3 + 0x1ec) < iVar4) {
    iVar8 = 0x10;
    if (0x10 < iVar4) {
      iVar8 = iVar4;
    }
    *(int *)((long)plVar3 + 0x1ec) = iVar8;
    lVar13 = 0;
    do {
      sVar9 = (long)*(int *)((long)plVar3 + 0x1ec) << 3;
      if ((void *)plVar3[lVar13 + 0x66] == (void *)0x0) {
        pvVar5 = malloc(sVar9);
      }
      else {
        pvVar5 = realloc((void *)plVar3[lVar13 + 0x66],sVar9);
      }
      plVar3[lVar13 + 0x66] = (long)pvVar5;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
  }
  memset((void *)plVar3[0x66],0,(long)(int)plVar3[0x3d] << 3);
  if ((*(int *)(*plVar3 + 0x5c) != 0) && (uVar6 = plVar3[0x19], uVar6 != 0)) {
    iVar4 = pObj->Id;
    if (((long)iVar4 < 0) || (*(int *)((long)plVar3 + 0x144) <= iVar4)) {
LAB_00520413:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    if ((int)plVar3[0x15] != (pObj->field_6).iTemp) {
      __assert_fail("p->iTarget == pObj->iTemp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x195,"void Sfm_ObjSetupSimInfo(Abc_Obj_t *)");
    }
    uVar12 = *(ulong *)(plVar3[0x29] + (long)iVar4 * 8);
    uVar10 = 0;
    do {
      if ((uVar6 >> (uVar10 & 0x3f) & 1) != 0) {
        bVar16 = (~uVar12 >> (uVar10 & 0x3f) & 1) != 0;
        uVar15 = (ulong)bVar16;
        iVar4 = *(int *)((long)plVar3 + uVar15 * 4 + 0x1d8);
        *(int *)((long)plVar3 + uVar15 * 4 + 0x1d8) = iVar4 + 1;
        local_238[(ulong)bVar16 * 0x40 + (long)iVar4] = (int)uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x40);
    lVar13 = 0;
    do {
      *(int *)((long)plVar3 + lVar13 * 4 + 0x1e0) =
           (*(int *)((long)plVar3 + lVar13 * 4 + 0x1d8) >> 6) + 1;
      lVar13 = lVar13 + 1;
    } while (lVar13 == 1);
    lVar13 = plVar3[0x13];
    if (0 < (long)(int)lVar13) {
      uVar12 = 0;
      uVar6 = (ulong)*(uint *)((long)plVar3 + 0x104);
      if ((int)*(uint *)((long)plVar3 + 0x104) < 1) {
        uVar6 = uVar12;
      }
      do {
        if (uVar12 == uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = *(int *)(plVar3[0x21] + uVar12 * 4);
        if (((long)iVar4 < 0) || (*(int *)((long)plVar3 + 0x144) <= iVar4)) goto LAB_00520413;
        uVar10 = *(ulong *)(plVar3[0x29] + (long)iVar4 * 8);
        puVar7 = local_238;
        lVar14 = 0;
        do {
          uVar15 = (ulong)*(int *)((long)plVar3 + lVar14 * 4 + 0x1d8);
          if (0 < (long)uVar15) {
            uVar11 = 0;
            do {
              if ((uVar10 >> ((ulong)(uint)puVar7[uVar11] & 0x3f) & 1) != 0) {
                if ((long)*(int *)((long)plVar1 + lVar14 * 0x10 + 4) <= (long)(uVar12 * 8)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                puVar2 = (ulong *)(plVar1[lVar14 * 2 + 1] + uVar12 * 0x40 +
                                  (uVar11 >> 6 & 0x3ffffff) * 8);
                *puVar2 = *puVar2 | 1L << ((byte)uVar11 & 0x3f);
              }
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
          puVar7 = puVar7 + 0x40;
          bVar16 = lVar14 == 0;
          lVar14 = lVar14 + 1;
        } while (bVar16);
        uVar12 = uVar12 + 1;
      } while (uVar12 != (long)(int)lVar13);
    }
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetupSimInfo( Abc_Obj_t * pObj )
{
    Sfm_Dec_t * p = Sfm_DecMan( pObj ); int i;
    p->nPats[0]     = p->nPats[1] = 0;
    p->nPatWords[0] = p->nPatWords[1] = 0;
    Vec_WrdFill( &p->vSets[0], p->nDivs*SFM_SIM_WORDS, 0 );
    Vec_WrdFill( &p->vSets[1], p->nDivs*SFM_SIM_WORDS, 0 );
    // alloc divwords
    p->nDivWords = Abc_Bit6WordNum( 4 * p->nDivs );
    if ( p->nDivWordsAlloc < p->nDivWords )
    {
        p->nDivWordsAlloc = Abc_MaxInt( 16, p->nDivWords );
        for ( i = 0; i < SFM_SUPP_MAX; i++ )
            p->pDivWords[i] = ABC_REALLOC( word, p->pDivWords[i], p->nDivWordsAlloc );
    }
    memset( p->pDivWords[0], 0, sizeof(word) * p->nDivWords );
    // collect simulation info
    if ( p->pPars->fUseSim && p->uCareSet != 0 )
    {
        word uCareSet = p->uCareSet;
        word uValues  = Sfm_DecObjSim(p, pObj);
        int c, d, i, Indexes[2][64];
        assert( p->iTarget == pObj->iTemp );
        assert( p->pPars->fUseSim );
        // find what patterns go to on-set/off-set
        for ( i = 0; i < 64; i++ )
            if ( (uCareSet >> i) & 1 )
            {
                c = !((uValues >> i) & 1);
                Indexes[c][p->nPats[c]++] = i;
            }
        for ( c = 0; c < 2; c++ )
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        // write patterns
        for ( d = 0; d < p->nDivs; d++ )
        {
            word uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
            for ( c = 0; c < 2; c++ )
                for ( i = 0; i < p->nPats[c]; i++ )
                    if ( (uSim >> Indexes[c][i]) & 1 )
                        Abc_TtSetBit( Sfm_DecDivPats(p, d, c), i );
        }
        //printf( "Node %d : Onset = %d. Offset = %d.\n", pObj->Id, p->nPats[0], p->nPats[1] );
    }
}